

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O2

void __thiscall helics::Publication::publishComplex(Publication *this,double *vals,int size)

{
  ulong uVar1;
  bool bVar2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> CV;
  SmallBuffer db;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_e8;
  data_view local_c8;
  data_view local_a8;
  SmallBuffer local_88;
  
  if (this->changeDetectionEnabled == true) {
    local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_e8,
               (long)size);
    uVar1 = 0;
    if (0 < size) {
      uVar1 = (ulong)(uint)size;
    }
    while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double_const&,double_const&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_e8,vals
                 ,vals + 1);
      vals = vals + 2;
    }
    bVar2 = changeDetected(&this->prevValue,
                           (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                           &local_e8,this->delta);
    if (bVar2) {
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                   *)&this->prevValue,
                  (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_e8)
      ;
      typeConvert(&local_88,this->pubType,
                  (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_e8)
      ;
      local_a8.dblock._M_len = local_88.bufferSize;
      local_a8.dblock._M_str = (char *)local_88.heap;
      local_a8.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_a8.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      helics::ValueFederate::publishBytes(this->fed,this,&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_a8.ref.
                  super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      SmallBuffer::~SmallBuffer(&local_88);
    }
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              (&local_e8);
  }
  else {
    typeConvertComplex(&local_88,this->pubType,vals,(long)size);
    local_c8.dblock._M_len = local_88.bufferSize;
    local_c8.dblock._M_str = (char *)local_88.heap;
    local_c8.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_c8.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_c8.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    SmallBuffer::~SmallBuffer(&local_88);
  }
  return;
}

Assistant:

void Publication::publishComplex(const double* vals, int size)
{
    if (changeDetectionEnabled) {
        std::vector<std::complex<double>> CV;
        CV.reserve(size);
        for (int ii = 0; ii < size; ++ii) {
            CV.emplace_back(vals[2 * ii], vals[2 * ii + 1]);
        }
        if (changeDetected(prevValue, CV, delta)) {
            prevValue = CV;
            auto db = typeConvert(pubType, CV);
            fed->publishBytes(*this, db);
        }
    } else {
        auto db = typeConvertComplex(pubType, vals, size);
        fed->publishBytes(*this, db);
    }
}